

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::execBitDxEa<(moira::Instr)30,(moira::Mode)0,(moira::Size)4>(Moira *this,u16 opcode)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = *(uint *)((long)this->exec + (ulong)(opcode >> 9 & 7) * 4 + -0x58);
  uVar2 = *(uint *)((long)this->exec + (ulong)(opcode & 7) * 4 + -0x58);
  (this->reg).sr.z = (uVar2 >> (uVar1 & 0x1f) & 1) == 0;
  prefetch<4ul>(this);
  (*this->_vptr_Moira[0x19])(this,(ulong)((uVar1 & 0x10) >> 3 | 4));
  *(uint *)((long)this->exec + (ulong)(opcode & 7) * 4 + -0x58) = uVar2 & ~(1 << (uVar1 & 0x1f));
  return;
}

Assistant:

void
Moira::execBitDxEa(u16 opcode)
{
    int src = ____xxx_________(opcode);
    int dst = _____________xxx(opcode);

    switch (M) {

        case 0:
        {
            u8 b = readD(src) & 0b11111;
            u32 data = readD(dst);
            data = bit<I>(data, b);

            prefetch<POLLIPL>();

            sync(cyclesBit<I>(b));
            if (I != BTST) writeD(dst, data);
            break;
        }
        default:
        {
            u8 b = readD(src) & 0b111;

            u32 ea, data;
            if (!readOp<M, Byte>(dst, ea, data)) return;

            data = bit<I>(data, b);

            if (I != BTST) {
                prefetch();
                writeM<M, Byte, POLLIPL>(ea, data);
            } else {
                prefetch<POLLIPL>();
            }
        }
    }
}